

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation_p.h
# Opt level: O3

QVariant *
_q_interpolateVariant<QLine>(QVariant *__return_storage_ptr__,QLine *from,QLine *to,qreal progress)

{
  type tVar1;
  type tVar2;
  long in_FS_OFFSET;
  QLine l;
  QPoint local_48;
  QPoint local_40;
  QPoint local_38;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = from->pt1;
  local_38 = to->pt1;
  tVar1 = _q_interpolate<QPoint>(&local_30,&local_38,progress);
  local_40 = from->pt2;
  local_48 = to->pt2;
  tVar2 = _q_interpolate<QPoint>(&local_40,&local_48,progress);
  l.pt2.xp.m_i = tVar2.xp.m_i;
  l.pt2.yp.m_i = tVar2.yp.m_i;
  l.pt1.xp.m_i = tVar1.xp.m_i;
  l.pt1.yp.m_i = tVar1.yp.m_i;
  QVariant::QVariant(__return_storage_ptr__,l);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QVariant _q_interpolateVariant(const T &from, const T &to, qreal progress)
{
    return _q_interpolate(from, to, progress);
}